

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.hh
# Opt level: O0

void __thiscall QPDFJob::Members::~Members(Members *this)

{
  Members *this_local;
  
  std::vector<QPDFJob::PageLabelSpec,_std::allocator<QPDFJob::PageLabelSpec>_>::~vector
            (&this->page_label_specs);
  std::__cxx11::string::~string((string *)&this->update_from_json);
  std::shared_ptr<char>::~shared_ptr(&this->outfilename);
  std::shared_ptr<char>::~shared_ptr(&this->infilename);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
  ::~map(&this->rotations);
  std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::~vector(&this->page_specs);
  std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::~vector
            (&this->overlay);
  std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::~vector
            (&this->underlay);
  std::__cxx11::string::~string((string *)&this->json_stream_prefix);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->json_objects);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->json_keys);
  std::__cxx11::list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>::
  ~list(&this->attachments_to_copy);
  std::__cxx11::list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>::~list
            (&this->attachments_to_add);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list(&this->attachments_to_remove);
  std::__cxx11::string::~string((string *)&this->attachment_to_show);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->collate);
  std::__cxx11::string::~string((string *)&this->force_version);
  std::__cxx11::string::~string((string *)&this->min_version);
  std::__cxx11::string::~string((string *)&this->linearize_pass1);
  std::__cxx11::string::~string((string *)&this->owner_password);
  std::__cxx11::string::~string((string *)&this->user_password);
  std::shared_ptr<char>::~shared_ptr(&this->encryption_file_password);
  std::__cxx11::string::~string((string *)&this->encryption_file);
  std::function<void_(int)>::~function(&this->progress_handler);
  std::shared_ptr<char>::~shared_ptr(&this->password);
  std::__cxx11::string::~string((string *)&this->message_prefix);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&this->log);
  return;
}

Assistant:

QPDF_DLL
        ~Members() = default;